

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# near_lossless_enc.c
# Opt level: O0

uint32_t NearLossless(uint32_t value,uint32_t predict,int max_quantization,int max_diff,
                     int used_subtract_green)

{
  byte bVar1;
  uint8_t uVar2;
  byte bVar3;
  byte bVar4;
  int in_ECX;
  int in_EDX;
  uint8_t uVar5;
  uint32_t in_ESI;
  uint32_t in_EDI;
  int in_R8D;
  uint8_t b;
  uint8_t g;
  uint8_t r;
  uint8_t a;
  uint8_t green_diff;
  uint8_t new_green;
  int quantization;
  undefined1 local_1f;
  undefined1 local_1e;
  undefined1 local_1d;
  undefined4 local_1c;
  undefined4 local_4;
  
  local_1d = '\0';
  local_1e = '\0';
  local_1c = in_EDX;
  if (in_ECX < 3) {
    local_4 = VP8LSubPixels(in_EDI,in_ESI);
  }
  else {
    for (; in_ECX <= local_1c; local_1c = local_1c >> 1) {
    }
    uVar2 = (uint8_t)(in_EDI >> 0x18);
    uVar5 = (uint8_t)(in_ESI >> 0x18);
    if ((in_EDI >> 0x18 == 0) || (in_EDI >> 0x18 == 0xff)) {
      local_1f = NearLosslessDiff(uVar2,uVar5);
    }
    else {
      local_1f = NearLosslessComponent(uVar2,uVar5,0xff,local_1c);
    }
    uVar2 = (uint8_t)(in_EDI >> 8);
    uVar5 = (uint8_t)(in_ESI >> 8);
    bVar1 = NearLosslessComponent(uVar2,uVar5,0xff,local_1c);
    if (in_R8D != 0) {
      local_1d = uVar5 + bVar1;
      local_1e = NearLosslessDiff(local_1d,uVar2);
    }
    uVar2 = NearLosslessDiff((uint8_t)(in_EDI >> 0x10),local_1e);
    bVar3 = NearLosslessComponent(uVar2,(uint8_t)(in_ESI >> 0x10),0xff - local_1d,local_1c);
    uVar2 = NearLosslessDiff((uint8_t)in_EDI,local_1e);
    bVar4 = NearLosslessComponent(uVar2,(uint8_t)in_ESI,0xff - local_1d,local_1c);
    local_4 = (uint)local_1f << 0x18 | (uint)bVar3 << 0x10 | (uint)bVar1 << 8 | (uint)bVar4;
  }
  return local_4;
}

Assistant:

static void NearLossless(int xsize, int ysize, const uint32_t* argb_src,
                         int stride, int limit_bits, uint32_t* copy_buffer,
                         uint32_t* argb_dst) {
  int x, y;
  const int limit = 1 << limit_bits;
  uint32_t* prev_row = copy_buffer;
  uint32_t* curr_row = prev_row + xsize;
  uint32_t* next_row = curr_row + xsize;
  memcpy(curr_row, argb_src, xsize * sizeof(argb_src[0]));
  memcpy(next_row, argb_src + stride, xsize * sizeof(argb_src[0]));

  for (y = 0; y < ysize; ++y, argb_src += stride, argb_dst += xsize) {
    if (y == 0 || y == ysize - 1) {
      memcpy(argb_dst, argb_src, xsize * sizeof(argb_src[0]));
    } else {
      memcpy(next_row, argb_src + stride, xsize * sizeof(argb_src[0]));
      argb_dst[0] = argb_src[0];
      argb_dst[xsize - 1] = argb_src[xsize - 1];
      for (x = 1; x < xsize - 1; ++x) {
        if (IsSmooth(prev_row, curr_row, next_row, x, limit)) {
          argb_dst[x] = curr_row[x];
        } else {
          argb_dst[x] = ClosestDiscretizedArgb(curr_row[x], limit_bits);
        }
      }
    }
    {
      // Three-way swap.
      uint32_t* const temp = prev_row;
      prev_row = curr_row;
      curr_row = next_row;
      next_row = temp;
    }
  }
}